

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

int lj_cf_error(lua_State *L)

{
  int32_t idx;
  int iVar1;
  lua_State *in_RDI;
  lua_State *unaff_retaddr;
  int32_t level;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  idx = lj_lib_optint(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int32_t)in_RDI);
  lua_settop((lua_State *)CONCAT44(idx,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  iVar1 = lua_isstring(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  if ((iVar1 != 0) && (0 < idx)) {
    luaL_where(L,level);
    lua_pushvalue(in_RDI,idx);
    lua_concat(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  }
  iVar1 = lua_error((lua_State *)0x184831);
  return iVar1;
}

Assistant:

LJLIB_CF(error)
{
  int32_t level = lj_lib_optint(L, 2, 1);
  lua_settop(L, 1);
  if (lua_isstring(L, 1) && level > 0) {
    luaL_where(L, level);
    lua_pushvalue(L, 1);
    lua_concat(L, 2);
  }
  return lua_error(L);
}